

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::EdgeChainSimplifier::MergeChain
          (EdgeChainSimplifier *this,vector<int,_std::allocator<int>_> *vertices)

{
  VertexId VVar1;
  VertexId v1;
  Iterator piVar2;
  VertexOutMap *this_00;
  pointer pvVar3;
  int iVar4;
  VertexId *pVVar5;
  pointer piVar6;
  vector<int,_std::allocator<int>_> *ids;
  size_type __n;
  ulong uVar7;
  long lVar8;
  pointer pvVar9;
  ostream *poVar10;
  ulong uVar11;
  EdgeId e_4;
  EdgeId e_1;
  VertexOutEdgeIds VVar12;
  reference rVar13;
  InputEdgeId id;
  IdSet local_c0;
  VertexOutEdgeIds local_a8;
  vector<bool,_std::allocator<bool>_> *local_a0;
  VertexOutMap *local_98;
  VertexOutEdgeIds local_90;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  merged_input_ids;
  vector<int,_std::allocator<int>_> degenerate_ids;
  
  merged_input_ids.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  merged_input_ids.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  merged_input_ids.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98 = &this->out_;
  local_a0 = &this->used_;
  uVar11 = 1;
  do {
    this_00 = local_98;
    pVVar5 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)piVar6 - (long)pVVar5 >> 2) <= uVar11) {
      if (degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          degenerate_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::
        __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ();
        AssignDegenerateEdges(this,&degenerate_ids,&merged_input_ids);
        pVVar5 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      VVar1 = *pVVar5;
      local_a0 = (vector<bool,_std::allocator<bool>_> *)CONCAT44(local_a0._4_4_,piVar6[-1]);
      local_a8.begin_ = pVVar5[1];
      VVar12 = Graph::VertexOutMap::edge_ids(this_00,VVar1,pVVar5[1]);
      for (lVar8 = (long)VVar12.begin_; (long)VVar12 >> 0x20 != lVar8; lVar8 = lVar8 + 1) {
        local_c0.begin_._4_4_ = (VertexId)local_a0;
        local_c0.begin_._0_4_ = VVar1;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   &this->new_edges_,(pair<int,_int> *)&local_c0);
        local_c0.begin_._0_4_ =
             (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&this->new_edge_layers_,(int *)&local_c0);
      }
      VVar12 = Graph::VertexOutMap::edge_ids(local_98,local_a8.begin_,VVar1);
      for (lVar8 = (long)VVar12.begin_;
          pvVar3 = merged_input_ids.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, (long)VVar12 >> 0x20 != lVar8;
          lVar8 = lVar8 + 1) {
        local_c0.begin_._0_4_ = (VertexId)local_a0;
        local_c0.begin_._4_4_ = VVar1;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   &this->new_edges_,(pair<int,_int> *)&local_c0);
        local_c0.begin_._0_4_ =
             (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&this->new_edge_layers_,(int *)&local_c0);
      }
      for (pvVar9 = merged_input_ids.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar3; pvVar9 = pvVar9 + 1
          ) {
        local_c0.begin_._0_4_ =
             IdSetLexicon::Add<std::vector<int,std::allocator<int>>>
                       (this->input_edge_id_set_lexicon_,pvVar9);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&this->new_input_edge_ids_,(int *)&local_c0);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&degenerate_ids.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&merged_input_ids);
      return;
    }
    VVar1 = pVVar5[uVar11 - 1];
    v1 = pVVar5[uVar11];
    local_a8 = Graph::VertexOutMap::edge_ids(local_98,VVar1,v1);
    local_90 = Graph::VertexOutMap::edge_ids(this_00,v1,VVar1);
    if (uVar11 == 1) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize(&merged_input_ids,
               ((long)local_90 * -0xffffffff >> 0x20) + ((long)local_a8 * -0xffffffff >> 0x20));
      pvVar3 = merged_input_ids.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar9 = merged_input_ids.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar3; pvVar9 = pvVar9 + 1
          ) {
        std::vector<int,_std::allocator<int>_>::reserve
                  (pvVar9,((long)(vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start >> 2) - 1);
      }
    }
    else {
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_interior_,(long)VVar1)
      ;
      if ((*rVar13._M_p & rVar13._M_mask) == 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                   ,0x6bd,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)local_c0.end_,"Check failed: is_interior_[v0] ");
        goto LAB_001f4729;
      }
      VVar12 = Graph::VertexOutMap::edge_ids(local_98,VVar1,VVar1);
      for (__n = (size_type)VVar12.begin_; __n != (long)VVar12 >> 0x20; __n = __n + 1) {
        Graph::input_edge_ids(&local_c0,this->g_,(EdgeId)__n);
        piVar2 = local_c0.end_;
        for (poVar10 = (ostream *)CONCAT44(local_c0.begin_._4_4_,(int32)local_c0.begin_);
            poVar10 != (ostream *)piVar2;
            poVar10 = (ostream *)((long)&poVar10->_vptr_basic_ostream + 4)) {
          id = *(InputEdgeId *)&poVar10->_vptr_basic_ostream;
          std::vector<int,_std::allocator<int>_>::push_back(&degenerate_ids,&id);
        }
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](local_a0,__n);
        *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
      }
    }
    iVar4 = local_a8.begin_;
    local_a8 = (VertexOutEdgeIds)((long)local_a8 >> 0x20);
    uVar7 = 0;
    for (VVar12 = (VertexOutEdgeIds)(long)iVar4; VVar12 != local_a8;
        VVar12 = (VertexOutEdgeIds)((long)VVar12 + 1)) {
      Graph::input_edge_ids(&local_c0,this->g_,VVar12.begin_);
      piVar2 = local_c0.end_;
      for (poVar10 = (ostream *)CONCAT44(local_c0.begin_._4_4_,(int32)local_c0.begin_);
          poVar10 != (ostream *)piVar2;
          poVar10 = (ostream *)((long)&poVar10->_vptr_basic_ostream + 4)) {
        id = *(InputEdgeId *)&poVar10->_vptr_basic_ostream;
        std::vector<int,_std::allocator<int>_>::push_back
                  (merged_input_ids.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar7,&id);
      }
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](local_a0,(size_type)VVar12);
      *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
      uVar7 = uVar7 + 1;
    }
    iVar4 = local_90.begin_;
    local_90 = (VertexOutEdgeIds)((long)local_90 >> 0x20);
    for (VVar12 = (VertexOutEdgeIds)(long)iVar4; VVar12 != local_90;
        VVar12 = (VertexOutEdgeIds)((long)VVar12 + 1)) {
      Graph::input_edge_ids(&local_c0,this->g_,VVar12.begin_);
      piVar2 = local_c0.end_;
      for (poVar10 = (ostream *)CONCAT44(local_c0.begin_._4_4_,(int32)local_c0.begin_);
          poVar10 != (ostream *)piVar2;
          poVar10 = (ostream *)((long)&poVar10->_vptr_basic_ostream + 4)) {
        id = *(InputEdgeId *)&poVar10->_vptr_basic_ostream;
        std::vector<int,_std::allocator<int>_>::push_back
                  (merged_input_ids.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar7,&id);
      }
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](local_a0,(size_type)VVar12);
      *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
      uVar7 = uVar7 + 1;
    }
    uVar11 = uVar11 + 1;
  } while (((long)merged_input_ids.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)merged_input_ids.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18 == (uVar7 & 0xffffffff));
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x6d7,kFatal,(ostream *)&std::cerr);
  std::operator<<((ostream *)local_c0.end_,"Check failed: (merged_input_ids.size()) == (j) ");
LAB_001f4729:
  abort();
}

Assistant:

void S2Builder::EdgeChainSimplifier::MergeChain(
    const vector<VertexId>& vertices) {
  // Suppose that all interior vertices have M outgoing edges and N incoming
  // edges.  Our goal is to group the edges into M outgoing chains and N
  // incoming chains, and then replace each chain by a single edge.
  vector<vector<InputEdgeId>> merged_input_ids;
  vector<InputEdgeId> degenerate_ids;
  int num_out;  // Edge count in the outgoing direction.
  for (int i = 1; i < vertices.size(); ++i) {
    VertexId v0 = vertices[i-1];
    VertexId v1 = vertices[i];
    auto out_edges = out_.edge_ids(v0, v1);
    auto in_edges = out_.edge_ids(v1, v0);
    if (i == 1) {
      // Allocate space to store the input edge ids associated with each edge.
      num_out = out_edges.size();
      merged_input_ids.resize(num_out + in_edges.size());
      for (vector<InputEdgeId>& ids : merged_input_ids) {
        ids.reserve(vertices.size() - 1);
      }
    } else {
      // For each interior vertex, we build a list of input edge ids
      // associated with degenerate edges.  Each input edge ids will be
      // assigned to one of the output edges later.  (Normally there are no
      // degenerate edges at all since most layer types don't want them.)
      S2_DCHECK(is_interior_[v0]);
      for (EdgeId e : out_.edge_ids(v0, v0)) {
        for (InputEdgeId id : g_.input_edge_ids(e)) {
          degenerate_ids.push_back(id);
        }
        used_[e] = true;
      }
    }
    // Because the edges were created in layer order, and all sorts used are
    // stable, the edges are still in layer order.  Therefore we can simply
    // merge together all the edges in the same relative position.
    int j = 0;
    for (EdgeId e : out_edges) {
      for (InputEdgeId id : g_.input_edge_ids(e)) {
        merged_input_ids[j].push_back(id);
      }
      used_[e] = true;
      ++j;
    }
    for (EdgeId e : in_edges) {
      for (InputEdgeId id : g_.input_edge_ids(e)) {
        merged_input_ids[j].push_back(id);
      }
      used_[e] = true;
      ++j;
    }
    S2_DCHECK_EQ(merged_input_ids.size(), j);
  }
  if (!degenerate_ids.empty()) {
    std::sort(degenerate_ids.begin(), degenerate_ids.end());
    AssignDegenerateEdges(degenerate_ids, &merged_input_ids);
  }
  // Output the merged edges.
  VertexId v0 = vertices[0], v1 = vertices[1], vb = vertices.back();
  for (EdgeId e : out_.edge_ids(v0, v1)) {
    new_edges_.push_back(Edge(v0, vb));
    new_edge_layers_.push_back(graph_edge_layer(e));
  }
  for (EdgeId e : out_.edge_ids(v1, v0)) {
    new_edges_.push_back(Edge(vb, v0));
    new_edge_layers_.push_back(graph_edge_layer(e));
  }
  for (const auto& ids : merged_input_ids) {
    new_input_edge_ids_.push_back(input_edge_id_set_lexicon_->Add(ids));
  }
}